

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::shaderVarValueStr_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,VarValue *value)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  uint extraout_EDX;
  uint precision;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar8;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  VarValue *value_00;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong uVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  ostringstream s;
  ostringstream result;
  undefined1 auStack_358 [8];
  string local_350;
  uint local_32c;
  string *local_328;
  char *local_320 [2];
  char local_310 [96];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  uVar4 = glu::getDataTypeScalarSize(*(DataType *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar8 = extraout_RDX;
  if (1 < (int)uVar4) {
    pcVar5 = glu::getDataTypeName(*(DataType *)this);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)(auStack_358 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x1b0);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    uVar8 = extraout_RDX_00;
  }
  local_32c = uVar4;
  local_328 = __return_storage_ptr__;
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      precision = (uint)uVar8;
      if (uVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        precision = extraout_EDX;
      }
      iVar2 = *(int *)this;
      if (iVar2 - 1U < 4) {
LAB_01570b2b:
        de::floatToString_abi_cxx11_
                  ((string *)local_320,(de *)0x2,*(float *)(this + uVar9 * 4 + 4),precision);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_320[0],(long)local_320[1]);
        uVar8 = extraout_RDX_01;
        uVar10 = local_310._0_8_;
        _Var11._M_p = local_320[0];
        if (local_320[0] != local_310) {
LAB_01570caf:
          operator_delete(_Var11._M_p,uVar10 + 1);
          uVar8 = extraout_RDX_06;
        }
      }
      else {
        uVar1 = iVar2 - 0x12;
        precision = CONCAT31((int3)(uVar1 >> 8),8 < uVar1);
        uVar8 = (ulong)precision;
        if (iVar2 - 5U < 9 || 8 >= uVar1) goto LAB_01570b2b;
        if (iVar2 - 0x1bU < 4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
          std::ostream::operator<<((VarValue *)local_320,*(int *)(this + uVar9 * 4 + 4));
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
          std::ios_base::~ios_base(local_2b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_350._M_dataplus._M_p,local_350._M_string_length);
          uVar8 = extraout_RDX_02;
LAB_01570c9b:
          uVar10 = local_350.field_2._M_allocated_capacity;
          _Var11._M_p = local_350._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p == &local_350.field_2) goto LAB_01570cb7;
          goto LAB_01570caf;
        }
        if (iVar2 - 0x1fU < 4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
          std::ostream::_M_insert<unsigned_long>((ulong)local_320);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
          std::ios_base::~ios_base(local_2b0);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                              local_350._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"u",1);
          uVar8 = extraout_RDX_03;
          goto LAB_01570c9b;
        }
        if (iVar2 - 0x23U < 4) {
          pcVar5 = "false";
          if ((ulong)(byte)this[uVar9 + 4] != 0) {
            pcVar5 = "true";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pcVar5,(ulong)(byte)this[uVar9 + 4] ^ 5);
          uVar8 = extraout_RDX_04;
        }
        else if (iVar2 - 0x27U < 0x1e) {
          getSamplerFillValue((VarValue *)local_320,(VarValue *)this);
          shaderVarValueStr_abi_cxx11_(&local_350,(Functional *)local_320,value_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_350._M_dataplus._M_p,local_350._M_string_length);
          uVar8 = extraout_RDX_05;
          goto LAB_01570c9b;
        }
      }
LAB_01570cb7:
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  psVar3 = local_328;
  if (1 < (int)local_32c) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

static string shaderVarValueStr (const VarValue& value)
{
	const int			numElems = glu::getDataTypeScalarSize(value.type);
	std::ostringstream	result;

	if (numElems > 1)
		result << glu::getDataTypeName(value.type) << "(";

	for (int i = 0; i < numElems; i++)
	{
		if (i > 0)
			result << ", ";

		if (glu::isDataTypeFloatOrVec(value.type) || glu::isDataTypeMatrix(value.type))
			result << de::floatToString(value.val.floatV[i], 2);
		else if (glu::isDataTypeIntOrIVec((value.type)))
			result << de::toString(value.val.intV[i]);
		else if (glu::isDataTypeUintOrUVec((value.type)))
			result << de::toString(value.val.uintV[i]) << "u";
		else if (glu::isDataTypeBoolOrBVec((value.type)))
			result << (value.val.boolV[i] ? "true" : "false");
		else if (glu::isDataTypeSampler((value.type)))
			result << shaderVarValueStr(getSamplerFillValue(value));
		else
			DE_ASSERT(false);
	}

	if (numElems > 1)
		result << ")";

	return result.str();
}